

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::
cni_holder<void_(cs_impl::fiber::Channel<cs_impl::any>::*)(),_void_(*)(cs_impl::fiber::Channel<cs_impl::any>_&)>
::cni_holder(cni_holder<void_(cs_impl::fiber::Channel<cs_impl::any>::*)(),_void_(*)(cs_impl::fiber::Channel<cs_impl::any>_&)>
             *this,offset_in_Channel<cs_impl::any>_to_subr *func)

{
  function<void_(cs_impl::fiber::Channel<cs_impl::any>_&)> *in_RDI;
  cni_helper<void_(*)(cs_impl::fiber::Channel<cs_impl::any>_&),_void_(*)(cs_impl::fiber::Channel<cs_impl::any>_&)>
  *this_00;
  offset_in_Channel<cs_impl::any>_to_subr *in_stack_ffffffffffffffc8;
  function<void_(cs_impl::fiber::Channel<cs_impl::any>_&)> *in_stack_ffffffffffffffd0;
  
  cni_holder_base::cni_holder_base((cni_holder_base *)in_RDI);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__cni_holder_003c3160;
  this_00 = (cni_helper<void_(*)(cs_impl::fiber::Channel<cs_impl::any>_&),_void_(*)(cs_impl::fiber::Channel<cs_impl::any>_&)>
             *)((long)&(in_RDI->super__Function_base)._M_functor + 8);
  std::function<void(cs_impl::fiber::Channel<cs_impl::any>&)>::
  function<void(cs_impl::fiber::Channel<cs_impl::any>::*const&)(),void>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  cni_helper<void_(*)(cs_impl::fiber::Channel<cs_impl::any>_&),_void_(*)(cs_impl::fiber::Channel<cs_impl::any>_&)>
  ::cni_helper(this_00,in_RDI);
  std::function<void_(cs_impl::fiber::Channel<cs_impl::any>_&)>::~function
            ((function<void_(cs_impl::fiber::Channel<cs_impl::any>_&)> *)0x2c3746);
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}